

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SGXMLScanner::scanCDSection(SGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  ReaderMgr *this_02;
  DatatypeValidator *dV;
  XMLDocumentHandler *pXVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  XMLCh XVar5;
  uint uVar6;
  XMLBuffer *toRelease;
  ComplexTypeInfo **ppCVar7;
  StackElem *pSVar8;
  XMLSize_t XVar9;
  UnexpectedEOFException *this_03;
  Codes toEmit;
  SchemaValidator *this_04;
  bool bVar10;
  XMLCh *value;
  XMLBufBid bbCData;
  XMLCh tmpBuf [9];
  XMLCh local_48 [12];
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  bVar3 = ReaderMgr::skippedChar(this_00,L'[');
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(this_00);
    bVar3 = ReaderMgr::skippedChar(this_00,L'[');
    if (!bVar3) {
      return;
    }
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toRelease = XMLBufferMgr::bidOnBuffer(this_01);
  this_02 = (this->super_XMLScanner).fValidator[4].fReaderMgr;
  cVar2 = '\x02';
  if (this_02->fCurReader != (XMLReader *)0x0) {
    ppCVar7 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                        ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)this_02);
    if (*ppCVar7 != (ComplexTypeInfo *)0x0) {
      uVar6 = (*ppCVar7)->fContentType;
      cVar2 = '\x01';
      if ((uVar6 & 0xfffffffd) != 4) {
        cVar2 = (uVar6 != 0) * '\x02';
      }
    }
  }
  pSVar8 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  bVar3 = false;
  bVar10 = false;
  do {
    XVar5 = ReaderMgr::getNextChar(this_00);
    uVar6 = (uint)(ushort)XVar5;
    if (XVar5 == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_03 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_03,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                 ,0x109a,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_03,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if (((((this->super_XMLScanner).fValidate == true) &&
         ((this->super_XMLScanner).fStandalone == true)) &&
        ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[uVar6] < '\0')) &&
       ((cVar2 == '\x01' && (pSVar8->fThisElement->fExternalElement != false)))) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
    }
    if ((XVar5 == L']') &&
       (bVar4 = XMLReader::skippedString((this->super_XMLScanner).fReaderMgr.fCurReader,L"]>"),
       bVar4)) {
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      XVar9 = toRelease->fIndex;
      value = toRelease->fBuffer;
      value[XVar9] = L'\0';
      if ((this->super_XMLScanner).fValidate == true) {
        this_04 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
        dV = this_04->fCurrentDatatypeValidator;
        if ((dV != (DatatypeValidator *)0x0) && (dV->fWhiteSpace != 0)) {
          SchemaValidator::normalizeWhiteSpace
                    (this_04,dV,value,&(this->super_XMLScanner).fWSNormalizeBuf,false);
          XVar9 = (this->super_XMLScanner).fWSNormalizeBuf.fIndex;
          value = (this->super_XMLScanner).fWSNormalizeBuf.fBuffer;
          value[XVar9] = L'\0';
          this_04 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
        }
        XMLBuffer::append(&this_04->fDatatypeBuffer,value);
        if (cVar2 != '\x02') {
          XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
        }
      }
      if ((((this->super_XMLScanner).fValidate == true) &&
          ((this->fICHandler != (IdentityConstraintHandler *)0x0 &
           (this->super_XMLScanner).fIdentityConstraintChecking) == 1)) &&
         (this->fICHandler->fMatcherStack->fMatchersCount != 0)) {
        XMLBuffer::append(&this->fContent,value,XVar9);
      }
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        if ((this->super_XMLScanner).fNormalizeData == false) {
          XVar9 = toRelease->fIndex;
          value = toRelease->fBuffer;
          value[XVar9] = L'\0';
        }
        (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,value,XVar9,1);
      }
      XMLBufferMgr::releaseBuffer(this_01,toRelease);
      return;
    }
    if (bVar10) {
LAB_002b46af:
      bVar10 = true;
    }
    else if ((uVar6 & 0xfc00) == 0xdc00) {
      toEmit = Unexpected2ndSurrogateChar;
      bVar10 = false;
      bVar4 = !bVar3;
      bVar3 = false;
      if (bVar4) {
LAB_002b470c:
        bVar3 = false;
        XMLScanner::emitError(&this->super_XMLScanner,toEmit);
        bVar10 = false;
      }
    }
    else if ((uVar6 & 0xfc00) == 0xd800) {
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      else {
        bVar3 = true;
      }
      bVar10 = false;
    }
    else {
      toEmit = Expected2ndSurrogateChar;
      if (bVar3) goto LAB_002b470c;
      bVar3 = false;
      bVar10 = false;
      if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[uVar6] & 0x40) == 0) {
        XMLString::binToText(uVar6,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager);
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        bVar3 = false;
        goto LAB_002b46af;
      }
    }
    XVar9 = toRelease->fIndex;
    if (XVar9 == toRelease->fCapacity) {
      XMLBuffer::ensureCapacity(toRelease,1);
      XVar9 = toRelease->fIndex;
    }
    toRelease->fIndex = XVar9 + 1;
    toRelease->fBuffer[XVar9] = XVar5;
  } while( true );
}

Assistant:

void SGXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool    gotLeadingSurrogate = false;

    // Get the character data opts for the current element
    XMLElementDecl::CharDataOpts charOpts = XMLElementDecl::AllCharData;
    // And see if the current element is a 'Children' style content model
    ComplexTypeInfo *currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
    if(currType)
    {
        SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes) currType->getContentType();
        if(modelType == SchemaElementDecl::Children ||
           modelType == SchemaElementDecl::ElementOnlyEmpty)
            charOpts = XMLElementDecl::SpacesOk;
        else if(modelType == SchemaElementDecl::Empty)
            charOpts = XMLElementDecl::NoCharData;
    }

    // should not be necessary when PSVI on element decl removed
    const ElemStack::StackElem* topElem = fElemStack.topElement();

    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        if (fValidate && fStandalone && (fReaderMgr.getCurrentReader()->isWhitespace(nextCh)))
        {
            // This document is standalone; this ignorable CDATA whitespace is forbidden.
            // XML 1.0, Section 2.9
            // And see if the current element is a 'Children' style content model
            if (topElem->fThisElement->isExternal()) {

                if (charOpts == XMLElementDecl::SpacesOk) // Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate) {
                emitError(XMLErrs::Expected2ndSurrogateChar);
            }

            XMLSize_t xsLen = bbCData.getLen();
            const XMLCh* xsNormalized = bbCData.getRawBuffer();
            if (fValidate) {

                DatatypeValidator* tempDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
                if (tempDV && tempDV->getWSFacet() != DatatypeValidator::PRESERVE)
                {
                    // normalize the character according to schema whitespace facet
                    ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, xsNormalized, fWSNormalizeBuf);
                    xsNormalized = fWSNormalizeBuf.getRawBuffer();
                    xsLen = fWSNormalizeBuf.getLen();
                }

                // tell the schema validation about the character data for checkContent later
                ((SchemaValidator*)fValidator)->setDatatypeBuffer(xsNormalized);

                if (charOpts != XMLElementDecl::AllCharData)
                {
                    // They definitely cannot handle any type of char data
                    fValidator->emitError(XMLValid::NoCharDataInCM);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }

            // call all active identity constraints
            if (toCheckIdentityConstraint() && fICHandler->getMatcherCount()) {
                fContent.append(xsNormalized, xsLen);
            }

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                if (fNormalizeData) {
                    fDocHandler->docCharacters(xsNormalized, xsLen, true);
                }
                else {
                    fDocHandler->docCharacters(
                        bbCData.getRawBuffer(), bbCData.getLen(), true
                    );
                }
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}